

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Abstract.h
# Opt level: O3

istream * covenant::operator>>(istream *in,AbstractMethod *abs)

{
  int iVar1;
  string *psVar2;
  AbstractMethod AVar3;
  string token;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  local_60 = 0;
  local_58[0] = 0;
  local_68 = local_58;
  std::operator>>(in,(string *)&local_68);
  iVar1 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar1 == 0) {
    AVar3 = SIGMA_STAR;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_68);
    AVar3 = CYCLE_BREAKING;
    if (iVar1 != 0) {
      psVar2 = (string *)__cxa_allocate_exception(0x20);
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"invalid abstraction method","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_48,local_48 + local_40);
      __cxa_throw(psVar2,&error::typeinfo,error::~error);
    }
  }
  *abs = AVar3;
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return in;
}

Assistant:

std::istream& operator>>(std::istream& in, AbstractMethod& abs)
{
    std::string token;
    in >> token;
    if (token == "sigma-star")
        abs = SIGMA_STAR;
    else if (token == "cycle-breaking")
        abs = CYCLE_BREAKING;
    else throw error("invalid abstraction method");
    return in;
}